

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

double tcu::rint(double __x)

{
  float a;
  float fVar1;
  undefined4 local_20;
  bool roundUp;
  float floorVal;
  float fracVal;
  float a_local;
  
  a = SUB84(__x,0);
  fVar1 = deFloatFrac(a);
  if ((fVar1 != 0.5) || (NAN(fVar1))) {
    fracVal = deFloatRound(a);
  }
  else {
    local_20 = 1.0;
    if ((long)(a - fVar1) % 2 == 0) {
      local_20 = 0.0;
    }
    fracVal = (a - fVar1) + local_20;
  }
  return (double)(ulong)(uint)fracVal;
}

Assistant:

static inline float rint (float a)
{
	DE_STATIC_ASSERT((-3 % 2 != 0) && (-4 % 2 == 0));

	float		fracVal		= deFloatFrac(a);

	if (fracVal != 0.5f)
		return deFloatRound(a); // Ordinary case.

	float	floorVal	= a - fracVal;
	bool	roundUp		= (deInt64)floorVal % 2 != 0;

	return floorVal + (roundUp ? 1.0f : 0.0f);
}